

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateRequestTimeIterativeAsync
               (HelicsFederate fed,HelicsTime requestTime,HelicsIterationRequest iterate,
               HelicsError *err)

{
  IterationRequest iterate_00;
  Federate *this;
  Time nextInternalTimeStep;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    nextInternalTimeStep.internalTimeCode = count_time<9,_long>::convert(requestTime);
    iterate_00 = anon_unknown.dwarf_5d555::getIterationRequest(iterate);
    helics::Federate::requestTimeIterativeAsync(this,nextInternalTimeStep,iterate_00);
  }
  return;
}

Assistant:

void helicsFederateRequestTimeIterativeAsync(HelicsFederate fed, HelicsTime requestTime, HelicsIterationRequest iterate, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->requestTimeIterativeAsync(requestTime, getIterationRequest(iterate));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}